

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

int dirExists(char *aDirPath)

{
  size_t sVar1;
  DIR *__dirp;
  DIR *lDir;
  char *aDirPath_local;
  
  if ((aDirPath != (char *)0x0) && (sVar1 = strlen(aDirPath), sVar1 != 0)) {
    __dirp = opendir(aDirPath);
    if (__dirp == (DIR *)0x0) {
      return 0;
    }
    closedir(__dirp);
    return 1;
  }
  return 0;
}

Assistant:

static int dirExists( char const * const aDirPath )
{
        DIR * lDir ;
        if ( ! aDirPath || ! strlen( aDirPath ) )
                return 0 ;
        lDir = opendir( aDirPath ) ;
        if ( ! lDir )
        {
                return 0 ;
        }
        closedir( lDir ) ;
        return 1 ;
}